

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDwaCompressorSimd.h
# Opt level: O0

void Imf_2_5::anon_unknown_9::dctInverse8x8_scalar<6>(float *data)

{
  float *pfVar1;
  long in_RDI;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  int column;
  int row;
  float *rowPtr;
  float gamma [4];
  float theta [4];
  float beta [4];
  float alpha [4];
  float g;
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  int local_78;
  int local_74;
  
  fVar2 = cosf(0.7853975);
  fVar2 = fVar2 * 0.5;
  fVar3 = cosf(0.19634938);
  fVar3 = fVar3 * 0.5;
  fVar4 = cosf(0.39269876);
  fVar4 = fVar4 * 0.5;
  fVar5 = cosf(0.58904815);
  fVar5 = fVar5 * 0.5;
  fVar6 = cosf(0.9817469);
  fVar6 = fVar6 * 0.5;
  fVar7 = cosf(1.1780963);
  fVar7 = fVar7 * 0.5;
  fVar8 = cosf(1.3744457);
  fVar8 = fVar8 * 0.5;
  for (local_74 = 0; local_74 < 2; local_74 = local_74 + 1) {
    pfVar1 = (float *)(in_RDI + (long)(local_74 << 3) * 4);
    fVar9 = fVar8 * pfVar1[7] + fVar6 * pfVar1[5] + fVar3 * pfVar1[1] + fVar5 * pfVar1[3];
    fVar10 = -fVar6 * pfVar1[7] + -fVar3 * pfVar1[5] + fVar5 * pfVar1[1] + -(fVar8 * pfVar1[3]);
    fVar11 = fVar5 * pfVar1[7] + fVar8 * pfVar1[5] + fVar6 * pfVar1[1] + -(fVar3 * pfVar1[3]);
    fVar12 = -fVar3 * pfVar1[7] + fVar5 * pfVar1[5] + fVar8 * pfVar1[1] + -(fVar6 * pfVar1[3]);
    fVar13 = fVar2 * (*pfVar1 + pfVar1[4]);
    fVar14 = fVar2 * (*pfVar1 - pfVar1[4]);
    fVar15 = fVar4 * pfVar1[2] + fVar7 * pfVar1[6];
    fVar16 = fVar7 * pfVar1[2] - fVar4 * pfVar1[6];
    fVar17 = fVar13 + fVar15;
    fVar18 = fVar14 + fVar16;
    fVar14 = fVar14 - fVar16;
    fVar13 = fVar13 - fVar15;
    *pfVar1 = fVar17 + fVar9;
    pfVar1[1] = fVar18 + fVar10;
    pfVar1[2] = fVar14 + fVar11;
    pfVar1[3] = fVar13 + fVar12;
    pfVar1[4] = fVar13 - fVar12;
    pfVar1[5] = fVar14 - fVar11;
    pfVar1[6] = fVar18 - fVar10;
    pfVar1[7] = fVar17 - fVar9;
  }
  for (local_78 = 0; local_78 < 8; local_78 = local_78 + 1) {
    fVar9 = fVar8 * *(float *)(in_RDI + (long)(local_78 + 0x38) * 4) +
            fVar6 * *(float *)(in_RDI + (long)(local_78 + 0x28) * 4) +
            fVar3 * *(float *)(in_RDI + (long)(local_78 + 8) * 4) +
            fVar5 * *(float *)(in_RDI + (long)(local_78 + 0x18) * 4);
    fVar10 = -fVar6 * *(float *)(in_RDI + (long)(local_78 + 0x38) * 4) +
             -fVar3 * *(float *)(in_RDI + (long)(local_78 + 0x28) * 4) +
             fVar5 * *(float *)(in_RDI + (long)(local_78 + 8) * 4) +
             -(fVar8 * *(float *)(in_RDI + (long)(local_78 + 0x18) * 4));
    fVar11 = fVar5 * *(float *)(in_RDI + (long)(local_78 + 0x38) * 4) +
             fVar8 * *(float *)(in_RDI + (long)(local_78 + 0x28) * 4) +
             fVar6 * *(float *)(in_RDI + (long)(local_78 + 8) * 4) +
             -(fVar3 * *(float *)(in_RDI + (long)(local_78 + 0x18) * 4));
    fVar12 = -fVar3 * *(float *)(in_RDI + (long)(local_78 + 0x38) * 4) +
             fVar5 * *(float *)(in_RDI + (long)(local_78 + 0x28) * 4) +
             fVar8 * *(float *)(in_RDI + (long)(local_78 + 8) * 4) +
             -(fVar6 * *(float *)(in_RDI + (long)(local_78 + 0x18) * 4));
    fVar13 = fVar2 * (*(float *)(in_RDI + (long)local_78 * 4) +
                     *(float *)(in_RDI + (long)(local_78 + 0x20) * 4));
    fVar14 = fVar2 * (*(float *)(in_RDI + (long)local_78 * 4) -
                     *(float *)(in_RDI + (long)(local_78 + 0x20) * 4));
    fVar15 = fVar4 * *(float *)(in_RDI + (long)(local_78 + 0x10) * 4) +
             fVar7 * *(float *)(in_RDI + (long)(local_78 + 0x30) * 4);
    fVar16 = fVar7 * *(float *)(in_RDI + (long)(local_78 + 0x10) * 4) -
             fVar4 * *(float *)(in_RDI + (long)(local_78 + 0x30) * 4);
    fVar17 = fVar13 + fVar15;
    fVar18 = fVar14 + fVar16;
    fVar14 = fVar14 - fVar16;
    fVar13 = fVar13 - fVar15;
    *(float *)(in_RDI + (long)local_78 * 4) = fVar17 + fVar9;
    *(float *)(in_RDI + (long)(local_78 + 8) * 4) = fVar18 + fVar10;
    *(float *)(in_RDI + (long)(local_78 + 0x10) * 4) = fVar14 + fVar11;
    *(float *)(in_RDI + (long)(local_78 + 0x18) * 4) = fVar13 + fVar12;
    *(float *)(in_RDI + (long)(local_78 + 0x20) * 4) = fVar13 - fVar12;
    *(float *)(in_RDI + (long)(local_78 + 0x28) * 4) = fVar14 - fVar11;
    *(float *)(in_RDI + (long)(local_78 + 0x30) * 4) = fVar18 - fVar10;
    *(float *)(in_RDI + (long)(local_78 + 0x38) * 4) = fVar17 - fVar9;
  }
  return;
}

Assistant:

void
dctInverse8x8_scalar (float *data)
{
    const float a = .5f * cosf (3.14159f / 4.0f);
    const float b = .5f * cosf (3.14159f / 16.0f);
    const float c = .5f * cosf (3.14159f / 8.0f);
    const float d = .5f * cosf (3.f*3.14159f / 16.0f);
    const float e = .5f * cosf (5.f*3.14159f / 16.0f);
    const float f = .5f * cosf (3.f*3.14159f / 8.0f);
    const float g = .5f * cosf (7.f*3.14159f / 16.0f);

    float alpha[4], beta[4], theta[4], gamma[4];

    float *rowPtr = NULL;

    //
    // First pass - row wise.
    //
    // This looks less-compact than the description above in
    // an attempt to fold together common sub-expressions.
    //

    for (int row = 0; row < 8 - zeroedRows; ++row)
    {
        rowPtr = data + row * 8;

        alpha[0] = c * rowPtr[2]; 
        alpha[1] = f * rowPtr[2]; 
        alpha[2] = c * rowPtr[6]; 
        alpha[3] = f * rowPtr[6]; 

        beta[0] = b * rowPtr[1] + d * rowPtr[3] + e * rowPtr[5] + g * rowPtr[7];
        beta[1] = d * rowPtr[1] - g * rowPtr[3] - b * rowPtr[5] - e * rowPtr[7];
        beta[2] = e * rowPtr[1] - b * rowPtr[3] + g * rowPtr[5] + d * rowPtr[7];
        beta[3] = g * rowPtr[1] - e * rowPtr[3] + d * rowPtr[5] - b * rowPtr[7];

        theta[0] = a * (rowPtr[0] + rowPtr[4]);
        theta[3] = a * (rowPtr[0] - rowPtr[4]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 


        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];


        rowPtr[0] = gamma[0] + beta[0];
        rowPtr[1] = gamma[1] + beta[1];
        rowPtr[2] = gamma[2] + beta[2];
        rowPtr[3] = gamma[3] + beta[3];

        rowPtr[4] = gamma[3] - beta[3];
        rowPtr[5] = gamma[2] - beta[2];
        rowPtr[6] = gamma[1] - beta[1];
        rowPtr[7] = gamma[0] - beta[0];
    }

    //
    // Second pass - column wise.
    //

    for (int column = 0; column < 8; ++column)
    {
        alpha[0] = c * data[16+column]; 
        alpha[1] = f * data[16+column]; 
        alpha[2] = c * data[48+column]; 
        alpha[3] = f * data[48+column]; 

        beta[0] = b * data[8+column]  + d * data[24+column] +
                  e * data[40+column] + g * data[56+column];

        beta[1] = d * data[8+column]  - g * data[24+column] -
                  b * data[40+column] - e * data[56+column];

        beta[2] = e * data[8+column]  - b * data[24+column] + 
                  g * data[40+column] + d * data[56+column];

        beta[3] = g * data[8+column]  - e * data[24+column] + 
                  d * data[40+column] - b * data[56+column];

        theta[0] = a * (data[column] + data[32+column]);
        theta[3] = a * (data[column] - data[32+column]);

        theta[1] = alpha[0] + alpha[3]; 
        theta[2] = alpha[1] - alpha[2]; 

        gamma[0] = theta[0] + theta[1];
        gamma[1] = theta[3] + theta[2];
        gamma[2] = theta[3] - theta[2];
        gamma[3] = theta[0] - theta[1];

        data[     column] = gamma[0] + beta[0];
        data[ 8 + column] = gamma[1] + beta[1];
        data[16 + column] = gamma[2] + beta[2];
        data[24 + column] = gamma[3] + beta[3];

        data[32 + column] = gamma[3] - beta[3];
        data[40 + column] = gamma[2] - beta[2];
        data[48 + column] = gamma[1] - beta[1];
        data[56 + column] = gamma[0] - beta[0];
    }
}